

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O3

string * cmJoin<cmGraphEdgeList>(string *__return_storage_ptr__,cmGraphEdgeList *r,char *delimiter)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  pointer __value;
  ostringstream os;
  ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_> local_1b0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if ((r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    __value = (r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
              super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (r->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    lVar2 = (long)pcVar1 - (long)__value >> 3;
    local_1b0._M_stream = (ostream_type *)local_1a0;
    local_1b0._M_string = delimiter;
    if (0 < lVar2) {
      uVar3 = lVar2 + 1;
      do {
        std::ostream_iterator<cmGraphEdge,_char,_std::char_traits<char>_>::operator=
                  (&local_1b0,__value);
        __value = __value + 1;
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    std::ostream::operator<<(local_1a0,pcVar1->Dest);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty())
    {
    return std::string();
    }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last,
      std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}